

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cclock.cpp
# Opt level: O3

void __thiscall CCLock::Reset(CCLock *this,bool shouldTrackThreadId)

{
  int iVar1;
  undefined8 uVar2;
  pthread_mutexattr_t local_14 [2];
  pthread_mutexattr_t mtconf;
  
  if (*(long *)this->mutexPtr != 0) {
    return;
  }
  if (shouldTrackThreadId) {
    iVar1 = pthread_mutexattr_init(local_14);
    if (iVar1 != 0) {
      uVar2 = 0x1c;
      goto LAB_0013f91a;
    }
    iVar1 = pthread_mutexattr_settype(local_14,1);
    if (iVar1 != 0) {
      uVar2 = 0x1d;
      goto LAB_0013f91a;
    }
    iVar1 = pthread_mutex_init((pthread_mutex_t *)this,local_14);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_destroy(local_14);
      if (iVar1 == 0) {
        return;
      }
      uVar2 = 0x25;
      goto LAB_0013f91a;
    }
  }
  else {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      return;
    }
  }
  uVar2 = 0x21;
LAB_0013f91a:
  fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
          ,uVar2,"err == 0","");
  fflush(_stderr);
  abort();
}

Assistant:

void CCLock::Reset(bool shouldTrackThreadId)
{
    Assert(sizeof(pthread_mutex_t) <= sizeof(this->mutexPtr));

    if (*((size_t*)mutexPtr) != 0)
    {
        return; // already initialized
    }

    int err;
    pthread_mutexattr_t mtconf;
    if (shouldTrackThreadId)
    {
        err = pthread_mutexattr_init(&mtconf); Assert(err == 0);
        err = pthread_mutexattr_settype(&mtconf, PTHREAD_MUTEX_RECURSIVE); Assert(err == 0);
    }

    pthread_mutex_t *mutex = (pthread_mutex_t*)this->mutexPtr;
    err = pthread_mutex_init(mutex, shouldTrackThreadId ? &mtconf : NULL); Assert(err == 0);

    if (shouldTrackThreadId)
    {
        err = pthread_mutexattr_destroy(&mtconf); Assert(err == 0);
    }
}